

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O0

pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
* __thiscall
jessilib::
word_split_once<std::basic_string_view<char8_t,std::char_traits<char8_t>>,__gnu_cxx::__normal_iterator<char8_t_const*,std::__cxx11::u8string>,__gnu_cxx::__normal_iterator<char8_t_const*,std::__cxx11::u8string>,char8_t>
          (pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
          begin,__normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                end,char8_t in_whitespace)

{
  bool bVar1;
  bool bVar2;
  reference pcVar3;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> bVar4;
  size_t local_a0;
  char8_t *local_98;
  size_t local_80;
  char8_t *local_78;
  size_t local_60;
  char8_t *local_58;
  __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  local_50;
  __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  itr;
  undefined1 local_40 [8];
  pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
  result;
  __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  _Stack_18;
  char8_t in_whitespace_local;
  __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  end_local;
  __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  begin_local;
  
  result.second._M_str._7_1_ = (char)end._M_current;
  _Stack_18._M_current = begin._M_current;
  end_local._M_current = (char8_t *)this;
  std::
  pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
  ::
  pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_true>
            ((pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
              *)local_40);
  itr._M_current._7_1_ =
       __gnu_cxx::operator<=><char8_t_const*,std::__cxx11::u8string>
                 (&end_local,&stack0xffffffffffffffe8);
  std::__cmp_cat::__unspec::__unspec((__unspec *)((long)&itr._M_current + 6),(__unspec *)0x0);
  bVar1 = std::operator>=(itr._M_current._7_1_);
  if (bVar1) {
    (__return_storage_ptr__->first)._M_len = (size_t)local_40;
    (__return_storage_ptr__->first)._M_str = (char8_t *)result.first._M_len;
    (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
    (__return_storage_ptr__->second)._M_str = (char8_t *)result.second._M_len;
  }
  else {
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                        (&end_local,&stack0xffffffffffffffe8);
      bVar1 = false;
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                 ::operator*(&end_local);
        bVar1 = *pcVar3 == result.second._M_str._7_1_;
      }
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
      ::operator++(&end_local);
    }
    local_50._M_current = end_local._M_current;
    while (bVar1 = __gnu_cxx::
                   operator==<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                             (&local_50,&stack0xffffffffffffffe8), ((bVar1 ^ 0xffU) & 1) != 0) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
               ::operator*(&local_50);
      if (*pcVar3 == result.second._M_str._7_1_) {
        bVar4 = make_word_split_member<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_nullptr>
                          (end_local,local_50);
        local_60 = bVar4._M_len;
        local_40 = (undefined1  [8])local_60;
        local_58 = bVar4._M_str;
        result.first._M_len = (size_t)local_58;
        __gnu_cxx::
        __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
        ::operator++(&local_50);
        while( true ) {
          bVar2 = __gnu_cxx::
                  operator==<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                            (&local_50,&stack0xffffffffffffffe8);
          bVar1 = false;
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            pcVar3 = __gnu_cxx::
                     __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                     ::operator*(&local_50);
            bVar1 = *pcVar3 == result.second._M_str._7_1_;
          }
          if (!bVar1) break;
          __gnu_cxx::
          __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
          ::operator++(&local_50);
        }
        bVar4 = make_word_split_member<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_nullptr>
                          (local_50,_Stack_18);
        local_80 = bVar4._M_len;
        local_78 = bVar4._M_str;
        (__return_storage_ptr__->first)._M_len = (size_t)local_40;
        (__return_storage_ptr__->first)._M_str = (char8_t *)result.first._M_len;
        (__return_storage_ptr__->second)._M_len = local_80;
        (__return_storage_ptr__->second)._M_str = local_78;
        return __return_storage_ptr__;
      }
      __gnu_cxx::
      __normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
      ::operator++(&local_50);
    }
    bVar4 = make_word_split_member<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_nullptr>
                      (end_local,_Stack_18);
    local_a0 = bVar4._M_len;
    local_98 = bVar4._M_str;
    (__return_storage_ptr__->first)._M_len = local_a0;
    (__return_storage_ptr__->first)._M_str = local_98;
    (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
    (__return_storage_ptr__->second)._M_str = (char8_t *)result.second._M_len;
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}